

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O2

Molecule * __thiscall Molecules::Get(Molecules *this,KEY_ID s)

{
  _Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> _Var1;
  KEY_ID local_10;
  KEY_ID s_local;
  
  local_10 = s;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Molecule>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->molecules)._M_h,&local_10);
  if (_Var1._M_cur != (__node_type *)0x0) {
    _Var1._M_cur = (__node_type *)((long)_Var1._M_cur + 0x10);
  }
  return (Molecule *)_Var1._M_cur;
}

Assistant:

Molecule *Molecules::Get(KEY_ID s)
{
	unordered_map<KEY_ID, Molecule>::iterator i;
//	cerr << "molecules.size(): "<< molecules.size() << endl;
	i = molecules.find(s);
	if (i != molecules.end())
		return &(i->second);
	return NULL;
}